

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutual_info.c
# Opt level: O0

double * inform_local_mutual_info(int *series,size_t l,size_t n,int *b,double *mi,inform_error *err)

{
  undefined8 uVar1;
  int iVar2;
  _Bool _Var3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  ulong uStack_90;
  int marginal_event;
  size_t j_1;
  size_t joint_event;
  size_t i_1;
  double m;
  double j;
  size_t i;
  double norm;
  inform_dist *joint;
  inform_dist **marginals;
  inform_error *piStack_40;
  _Bool allocate_mi;
  inform_error *err_local;
  double *mi_local;
  int *b_local;
  size_t n_local;
  size_t l_local;
  int *series_local;
  
  piStack_40 = err;
  err_local = (inform_error *)mi;
  mi_local = (double *)b;
  b_local = (int *)n;
  n_local = l;
  l_local = (size_t)series;
  _Var3 = check_arguments(series,l,n,b,err);
  if (_Var3) {
    series_local = (int *)0x0;
  }
  else {
    marginals._7_1_ = err_local == (inform_error *)0x0;
    if (((bool)marginals._7_1_) &&
       (err_local = (inform_error *)malloc((long)b_local << 3), err_local == (inform_error *)0x0)) {
      if (piStack_40 != (inform_error *)0x0) {
        *piStack_40 = INFORM_ENOMEM;
      }
      series_local = (int *)0x0;
    }
    else {
      joint = (inform_dist *)malloc(n_local << 3);
      if (joint == (inform_dist *)0x0) {
        if (piStack_40 != (inform_error *)0x0) {
          *piStack_40 = INFORM_ENOMEM;
        }
        series_local = (int *)0x0;
      }
      else {
        norm = 0.0;
        _Var3 = allocate((int *)mi_local,n_local,(inform_dist **)&norm,(inform_dist **)joint,
                         piStack_40);
        if (_Var3) {
          if ((marginals._7_1_ & 1) != 0) {
            free(err_local);
          }
          free(joint);
          series_local = (int *)0x0;
        }
        else {
          accumulate((int *)l_local,n_local,(size_t)b_local,(int *)mi_local,(inform_dist *)norm,
                     (inform_dist **)joint);
          i = 0x3ff0000000000000;
          for (j = 0.0; (ulong)j < n_local; j = (double)((long)j + 1)) {
            uVar1 = *(undefined8 *)((&joint->histogram)[(long)j] + 4);
            auVar5._8_4_ = (int)((ulong)uVar1 >> 0x20);
            auVar5._0_8_ = uVar1;
            auVar5._12_4_ = 0x45300000;
            i = (size_t)(((auVar5._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)) * (double)i
                        );
          }
          uVar1 = *(undefined8 *)((long)norm + 0x10);
          auVar6._8_4_ = (int)((ulong)uVar1 >> 0x20);
          auVar6._0_8_ = uVar1;
          auVar6._12_4_ = 0x45300000;
          for (joint_event = 0; joint_event < b_local; joint_event = joint_event + 1) {
            i_1 = 0x3ff0000000000000;
            j_1 = 0;
            for (uStack_90 = 0; uStack_90 < n_local; uStack_90 = uStack_90 + 1) {
              iVar2 = *(int *)(l_local + (joint_event + (long)b_local * uStack_90) * 4);
              i_1 = (size_t)((double)*(uint *)(*(long *)(&joint->histogram)[uStack_90] +
                                              (long)iVar2 * 4) * (double)i_1);
              j_1 = j_1 * (long)*(int *)((long)mi_local + uStack_90 * 4) + (long)iVar2;
            }
            dVar4 = log2(((double)*(uint *)(*(long *)norm + j_1 * 4) *
                         ((double)i /
                         ((auVar6._8_8_ - 1.9342813113834067e+25) +
                         ((double)CONCAT44(0x43300000,(int)uVar1) - 4503599627370496.0)))) /
                         (double)i_1);
            *(double *)(err_local + joint_event * 2) = dVar4;
          }
          free_all((inform_dist **)&norm,(inform_dist **)joint,n_local);
          series_local = err_local;
        }
      }
    }
  }
  return (double *)series_local;
}

Assistant:

double *inform_local_mutual_info(int const *series, size_t l, size_t n,
    int const *b, double *mi, inform_error *err)
{
    if (check_arguments(series, l, n, b, err)) return NULL;

    bool allocate_mi = (mi == NULL);
    if (allocate_mi)
    {
        mi = malloc(n * sizeof(double));
        if (mi == NULL)
        {
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
        }
    }

    inform_dist **marginals = malloc(l * sizeof(inform_dist*));
    if (marginals == NULL)
    {
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, NULL);
    }
    inform_dist *joint = NULL;
    if (allocate(b, l, &joint, marginals, err))
    {
        if (allocate_mi) free(mi);
        free(marginals);
        return NULL;
    }

    accumulate(series, l, n, b, joint, marginals);

    double norm = 1;
    for (size_t i = 0; i < l; ++i) norm *= marginals[i]->counts;
    norm /= joint->counts;

    double j, m;
    for (size_t i = 0; i < n; ++i)
    {
        m = 1;
        size_t joint_event = 0;
        for (size_t j = 0; j < l; ++j)
        {
            int marginal_event = series[i + n * j];
            m *= marginals[j]->histogram[marginal_event];
            joint_event = joint_event * b[j] + marginal_event;
        }
        j = joint->histogram[joint_event];
        mi[i] = log2((j * norm) / m);
    }

    free_all(&joint, marginals, l);

    return mi;
}